

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::throw_exception(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *this)

{
  parse_error *__return_storage_ptr__;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string error_msg;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&error_msg,"syntax error - ",(allocator *)&local_d0);
  if (this->last_token == parse_error) {
    std::__cxx11::string::string((string *)&local_30,(this->m_lexer).error_message,&local_d1);
    std::operator+(&local_90,&local_30,"; last read: \'");
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string(&local_50,&this->m_lexer);
    std::operator+(&local_b0,&local_90,&local_50);
    std::operator+(&local_d0,&local_b0,"\'");
    std::__cxx11::string::append((string *)&error_msg);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_30;
  }
  else {
    pcVar1 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::token_type_name(this->last_token);
    std::__cxx11::string::string((string *)&local_b0,pcVar1,(allocator *)&local_90);
    std::operator+(&local_d0,"unexpected ",&local_b0);
    std::__cxx11::string::append((string *)&error_msg);
    std::__cxx11::string::~string((string *)&local_d0);
    this_00 = &local_b0;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->expected != uninitialized) {
    pcVar1 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::token_type_name(this->expected);
    std::__cxx11::string::string((string *)&local_b0,pcVar1,(allocator *)&local_90);
    std::operator+(&local_d0,"; expected ",&local_b0);
    std::__cxx11::string::append((string *)&error_msg);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  __return_storage_ptr__ = (parse_error *)__cxa_allocate_exception(0x28);
  parse_error::create(__return_storage_ptr__,0x65,(this->m_lexer).chars_read,&error_msg);
  __cxa_throw(__return_storage_ptr__,&parse_error::typeinfo,exception::~exception);
}

Assistant:

[[noreturn]] void throw_exception() const
    {
        std::string error_msg = "syntax error - ";
        if (last_token == token_type::parse_error)
        {
            error_msg += std::string(m_lexer.get_error_message()) + "; last read: '" +
                         m_lexer.get_token_string() + "'";
        }
        else
        {
            error_msg += "unexpected " + std::string(lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += "; expected " + std::string(lexer_t::token_type_name(expected));
        }

        JSON_THROW(parse_error::create(101, m_lexer.get_position(), error_msg));
    }